

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::AggressiveDCEPass::KillDeadInstructions
          (AggressiveDCEPass *this,Function *func,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *structured_order)

{
  long lVar1;
  BasicBlock *bp;
  Instruction *pIVar2;
  IRContext *pIVar3;
  DefUseManager *this_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var4;
  AggressiveDCEPass *pAVar5;
  char cVar6;
  bool bVar7;
  uint32_t uVar8;
  PodType id;
  Operand *__cur;
  Instruction *pIVar9;
  uint uVar10;
  pointer pOVar11;
  pointer pOVar12;
  _List_node_base *p_Var13;
  bool modified;
  uint32_t merge_block_id;
  undefined1 local_d9;
  AggressiveDCEPass *local_d8;
  uint32_t local_cc;
  undefined1 local_c8 [16];
  iterator local_b8;
  code *pcStack_b0;
  code **local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_98;
  _Any_data local_78;
  PodType local_68;
  PodType PStack_64;
  code **ppcStack_60;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_58;
  BitVector *local_48;
  Function *local_40;
  _List_node_base *local_38;
  
  local_d9 = 0;
  p_Var13 = (structured_order->
            super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var13 != (_List_node_base *)structured_order) {
    local_48 = &this->live_insts_;
    local_d8 = this;
    local_40 = func;
    local_38 = (_List_node_base *)structured_order;
    do {
      local_cc = 0;
      lVar1 = (long)p_Var13[1]._M_next;
      local_68.data._M_elems = (array<signed_char,_4UL>)0x0;
      PStack_64.data._M_elems = (array<signed_char,_4UL>)0x0;
      ppcStack_60 = (code **)0x0;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_78._M_unused._M_object = operator_new(0x18);
      *(AggressiveDCEPass **)local_78._M_unused._0_8_ = local_d8;
      *(undefined1 **)((long)local_78._M_unused._0_8_ + 8) = &local_d9;
      *(uint32_t **)((long)local_78._M_unused._0_8_ + 0x10) = &local_cc;
      ppcStack_60 = (code **)std::
                             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:288:24)>
                             ::_M_invoke;
      _local_68 = std::
                  _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:288:24)>
                  ::_M_manager;
      local_c8._8_8_ = (BasicBlock *)0x0;
      local_c8._0_8_ = &local_78;
      pcStack_b0 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
                   ::_M_invoke;
      local_b8.node_ =
           (Instruction *)
           std::
           _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
           ::_M_manager;
      pOVar11 = *(pointer *)(lVar1 + 8);
      if (pOVar11 != (pointer)0x0) {
        local_98.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start = pOVar11;
        std::
        _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:288:24)>
        ::_M_invoke((_Any_data *)local_c8._0_8_,(Instruction **)&local_98);
      }
      pOVar11 = *(pointer *)(lVar1 + 0x20);
      if ((pOVar11 != (pointer)0x0) && ((pOVar11->words).buffer[0].data._M_elems[0] == '\0')) {
        do {
          if (pOVar11 == (pointer)0x0) break;
          pOVar12 = (pointer)(pOVar11->words)._vptr_SmallVector;
          local_98.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = pOVar11;
          if (local_b8.node_ == (Instruction *)0x0) {
            std::__throw_bad_function_call();
          }
          if ((pOVar12->words).buffer[0].data._M_elems[0] != '\0') {
            pOVar12 = (pointer)0x0;
          }
          cVar6 = (*pcStack_b0)((InstructionBuilder *)local_c8,&local_98);
          pOVar11 = pOVar12;
        } while (cVar6 != '\0');
      }
      if (local_b8.node_ != (Instruction *)0x0) {
        (*(code *)local_b8.node_)((InstructionBuilder *)local_c8,(InstructionBuilder *)local_c8,3);
      }
      if ((PodType  [2])_local_68 != (PodType  [2])0x0) {
        (*_local_68)(&local_78,&local_78,3);
      }
      bp = (BasicBlock *)p_Var13[1]._M_next;
      if (local_cc == 0) {
        pIVar2 = (bp->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        if ((pIVar2 == (Instruction *)0x0) ||
           ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
        goto LAB_00562210;
        bVar7 = IsLive(local_d8,(bp->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                                sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                                previous_node_);
        if (!bVar7) {
          local_c8._0_8_ = (local_d8->super_MemPass).super_Pass.context_;
          local_c8._8_8_ = p_Var13[1]._M_next;
          local_b8.node_ =
               &(((BasicBlock *)local_c8._8_8_)->insts_).
                super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pcStack_b0 = (code *)CONCAT44(pcStack_b0._4_4_,3);
          InstructionBuilder::AddUnreachable((InstructionBuilder *)local_c8);
        }
        p_Var13 = p_Var13->_M_next;
      }
      else {
        AddBranch(local_d8,local_cc,bp);
        do {
          p_Var13 = (((_List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          pIVar2 = *(Instruction **)((long)p_Var13[1]._M_next + 8);
          uVar8 = 0;
          if (pIVar2->has_result_id_ == true) {
            uVar8 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
          }
        } while (uVar8 != local_cc);
        lVar1 = *(long *)((long)p_Var13[1]._M_next + 0x20);
        if ((lVar1 == 0) || (*(char *)(lVar1 + 0x18) != '\0')) {
LAB_00562210:
          __assert_fail("!insts_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                        ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
        }
        pIVar2 = *(Instruction **)((long)p_Var13[1]._M_next + 0x28);
        if (pIVar2->opcode_ == OpUnreachable) {
          pIVar3 = (local_d8->super_MemPass).super_Pass.context_;
          if ((pIVar3->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar3);
          }
          this_00 = (pIVar3->def_use_mgr_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                    .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                    _M_head_impl;
          _Var4._M_head_impl =
               (local_40->def_inst_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar8 = 0;
          if ((_Var4._M_head_impl)->has_type_id_ == true) {
            uVar8 = Instruction::GetSingleWordOperand(_Var4._M_head_impl,0);
          }
          pIVar9 = analysis::DefUseManager::GetDef(this_00,uVar8);
          if (pIVar9->opcode_ == OpTypeVoid) {
            pIVar2->opcode_ = OpReturn;
          }
          else {
            _Var4._M_head_impl =
                 (local_40->def_inst_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            uVar8 = 0;
            if ((_Var4._M_head_impl)->has_type_id_ == true) {
              uVar8 = Instruction::GetSingleWordOperand(_Var4._M_head_impl,0);
            }
            pAVar5 = local_d8;
            id.data._M_elems =
                 (array<signed_char,_4UL>)MemPass::Type2Undef(&local_d8->super_MemPass,uVar8);
            pIVar3 = (pAVar5->super_MemPass).super_Pass.context_;
            if ((pIVar3->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar3);
            }
            pIVar9 = analysis::DefUseManager::GetDef
                               ((pIVar3->def_use_mgr_)._M_t.
                                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                ._M_head_impl,(uint32_t)id.data._M_elems);
            if (pIVar9->unique_id_ == 0) goto LAB_0056222f;
            utils::BitVector::Set(local_48,pIVar9->unique_id_);
            pIVar2->opcode_ = OpReturnValue;
            local_78._M_unused._M_object = &PTR__SmallVector_009488e0;
            ppcStack_60 = (code **)&local_68;
            local_58._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
            local_68.data._M_elems = id.data._M_elems;
            local_78._8_8_ = 1;
            local_c8._0_4_ = 1;
            local_c8._8_8_ = &PTR__SmallVector_009488e0;
            local_b8.node_ = (Instruction *)0x0;
            local_a8 = &pcStack_b0;
            local_a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),
                       (SmallVector<unsigned_int,_2UL> *)&local_78);
            local_98.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_98.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_98.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
            pOVar11 = local_98.
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
            (local_98.
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start)->type = local_c8._0_4_;
            ((local_98.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start)->words)._vptr_SmallVector =
                 (_func_int **)&PTR__SmallVector_009488e0;
            ((local_98.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start)->words).size_ = 0;
            ((local_98.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start)->words).small_data_ =
                 (uint *)((local_98.
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start)->words).buffer;
            ((local_98.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start)->words).large_data_._M_t.
            super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_98.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar11;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      (&(local_98.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start)->words,
                       (SmallVector<unsigned_int,_2UL> *)(local_c8 + 8));
            uVar10 = (pIVar2->has_result_id_ & 1) + 1;
            if (pIVar2->has_type_id_ == false) {
              uVar10 = (uint)pIVar2->has_result_id_;
            }
            local_98.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_finish = pOVar11;
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                      (&pIVar2->operands_,
                       (Operand *)
                       ((long)((((pIVar2->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->words).buffer + -6) +
                       (ulong)(uVar10 * 0x30)),
                       (pIVar2->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                      ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                       &pIVar2->operands_,
                       (pIVar2->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       local_98.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_98.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                      (&local_98);
            structured_order =
                 (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
                 local_38;
            local_c8._8_8_ = &PTR__SmallVector_009488e0;
            if (local_a0 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_a0,local_a0);
            }
            local_a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_78._M_unused._M_object = &PTR__SmallVector_009488e0;
            if (local_58._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl !=
                (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )0x0) {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_58,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         local_58._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl);
            }
            pIVar3 = (local_d8->super_MemPass).super_Pass.context_;
            if ((pIVar3->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar3);
            }
            analysis::DefUseManager::AnalyzeInstUse
                      ((pIVar3->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,pIVar2);
          }
          if (pIVar2->unique_id_ == 0) {
LAB_0056222f:
            __assert_fail("unique_id_ != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0xfb,"uint32_t spvtools::opt::Instruction::unique_id() const");
          }
          utils::BitVector::Set(local_48,pIVar2->unique_id_);
        }
      }
    } while (p_Var13 != (_List_node_base *)structured_order);
  }
  return (bool)local_d9;
}

Assistant:

bool AggressiveDCEPass::KillDeadInstructions(
    const Function* func, std::list<BasicBlock*>& structured_order) {
  bool modified = false;
  for (auto bi = structured_order.begin(); bi != structured_order.end();) {
    uint32_t merge_block_id = 0;
    (*bi)->ForEachInst([this, &modified, &merge_block_id](Instruction* inst) {
      if (IsLive(inst)) return;
      if (inst->opcode() == spv::Op::OpLabel) return;
      // If dead instruction is selection merge, remember merge block
      // for new branch at end of block
      if (inst->opcode() == spv::Op::OpSelectionMerge ||
          inst->opcode() == spv::Op::OpLoopMerge)
        merge_block_id = inst->GetSingleWordInOperand(0);
      to_kill_.push_back(inst);
      modified = true;
    });
    // If a structured if or loop was deleted, add a branch to its merge
    // block, and traverse to the merge block and continue processing there.
    // We know the block still exists because the label is not deleted.
    if (merge_block_id != 0) {
      AddBranch(merge_block_id, *bi);
      for (++bi; (*bi)->id() != merge_block_id; ++bi) {
      }

      auto merge_terminator = (*bi)->terminator();
      if (merge_terminator->opcode() == spv::Op::OpUnreachable) {
        // The merge was unreachable. This is undefined behaviour so just
        // return (or return an undef). Then mark the new return as live.
        auto func_ret_type_inst = get_def_use_mgr()->GetDef(func->type_id());
        if (func_ret_type_inst->opcode() == spv::Op::OpTypeVoid) {
          merge_terminator->SetOpcode(spv::Op::OpReturn);
        } else {
          // Find an undef for the return value and make sure it gets kept by
          // the pass.
          auto undef_id = Type2Undef(func->type_id());
          auto undef = get_def_use_mgr()->GetDef(undef_id);
          live_insts_.Set(undef->unique_id());
          merge_terminator->SetOpcode(spv::Op::OpReturnValue);
          merge_terminator->SetInOperands({{SPV_OPERAND_TYPE_ID, {undef_id}}});
          get_def_use_mgr()->AnalyzeInstUse(merge_terminator);
        }
        live_insts_.Set(merge_terminator->unique_id());
      }
    } else {
      Instruction* inst = (*bi)->terminator();
      if (!IsLive(inst)) {
        // If the terminator is not live, this block has no live instructions,
        // and it will be unreachable.
        AddUnreachable(*bi);
      }
      ++bi;
    }
  }
  return modified;
}